

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall
helics::FilterFederate::generateProcessMarker
          (FilterFederate *this,GlobalFederateId fid,uint32_t pid,Time returnTime)

{
  bool bVar1;
  FilterFederate *in_RCX;
  undefined4 in_EDX;
  BaseType in_ESI;
  ActionMessage *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar2;
  ActionMessage block;
  BaseType fid_index;
  ActionMessage *__args;
  int32_t id;
  undefined4 in_stack_ffffffffffffff08;
  action_t in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  GlobalFederateId local_dc;
  key_type_conflict2 *in_stack_ffffffffffffff28;
  GlobalFederateId in_stack_ffffffffffffff30;
  InterfaceHandle in_stack_ffffffffffffff34;
  GlobalFederateId local_4;
  
  local_4.gid = in_ESI;
  GlobalFederateId::baseValue(&local_4);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff34.hid,in_stack_ffffffffffffff30.gid),
               in_stack_ffffffffffffff28);
  bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)0x6401d7);
  if (bVar1) {
    __args = (ActionMessage *)&stack0xffffffffffffff28;
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff0c);
    GlobalFederateId::GlobalFederateId(&local_dc,(GlobalBrokerId)in_RDI->messageID);
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)in_RDI,__args);
    ActionMessage::~ActionMessage(in_RDI);
    in_stack_ffffffffffffff30.gid = local_4.gid;
  }
  id = (int32_t)((ulong)in_RDI >> 0x20);
  std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffff34.hid,in_stack_ffffffffffffff30.gid),
               in_stack_ffffffffffffff28);
  pVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffff14,in_EDX),
                     (value_type_conflict2 *)
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  addTimeReturn(in_RCX,id,(Time)pVar2.first._M_node._M_node);
  return;
}

Assistant:

void FilterFederate::generateProcessMarker(GlobalFederateId fid, uint32_t pid, Time returnTime)
{
    // nothing further to process
    auto fid_index = fid.baseValue();
    if (ongoingFilterProcesses[fid_index].empty()) {
        ActionMessage block(CMD_TIME_BLOCK);
        block.dest_id = mCoreID;
        block.source_id = fid;
        mSendMessage(block);
    }
    ongoingFilterProcesses[fid_index].insert(pid);
    addTimeReturn(pid, returnTime);
}